

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_pubsub_on_channel_create(channel_s *ch)

{
  fio_match_fn p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [24];
  undefined1 auVar7 [24];
  undefined1 auVar8 [24];
  fio_msg_internal_s *m_;
  uint32_t type;
  fio_engine_set__ordered_s_ *pfVar9;
  fio_lock_i ret;
  fio_str_info_s msg;
  timespec local_68;
  char *local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong *local_38;
  ulong local_30 [2];
  size_t sStack_20;
  char *local_18;
  
  LOCK();
  UNLOCK();
  local_68.tv_sec = CONCAT71(local_68.tv_sec._1_7_,fio_postoffice.engines.lock);
  if (fio_postoffice.engines.lock != '\0') {
    do {
      fio_postoffice.engines.lock = '\x01';
      local_68.tv_sec = 0;
      local_68.tv_nsec = 1;
      nanosleep(&local_68,(timespec *)0x0);
      LOCK();
      UNLOCK();
      local_68.tv_sec = CONCAT71(local_68.tv_sec._1_7_,fio_postoffice.engines.lock);
    } while (fio_postoffice.engines.lock != '\0');
  }
  fio_postoffice.engines.lock = '\x01';
  pfVar9 = fio_postoffice.engines.set.ordered;
  if (fio_postoffice.engines.set.ordered != (fio_engine_set__ordered_s_ *)0x0) {
    for (; pfVar9 < fio_postoffice.engines.set.ordered + fio_postoffice.engines.set.pos;
        pfVar9 = pfVar9 + 1) {
      if (pfVar9->hash != 0) {
        local_30[1] = 0;
        sStack_20 = ch->name_len;
        local_18 = ch->name;
        uVar2 = ch->name_len;
        uVar3 = ch->name;
        auVar6._8_8_ = uVar3;
        auVar6._0_8_ = uVar2;
        auVar6._16_8_ = 0;
        (*pfVar9->obj->subscribe)(pfVar9->obj,(fio_str_info_s)(auVar6 << 0x40),ch->match);
      }
    }
  }
  LOCK();
  fio_postoffice.engines.lock = '\0';
  UNLOCK();
  if ((((fio_data->is_worker != '\0') && (ch != (channel_s *)0x0)) && (fio_data->workers != 1)) &&
     (cluster_data.uuid != 0)) {
    local_68.tv_sec = 0;
    local_68.tv_nsec = ch->name_len;
    local_58 = ch->name;
    uVar4 = ch->name_len;
    uVar5 = ch->name;
    auVar7._8_8_ = uVar5;
    auVar7._0_8_ = uVar4;
    local_38 = (ulong *)0x0;
    local_48 = 0;
    uStack_40 = 0;
    local_30[0] = 0;
    p_Var1 = ch->match;
    if (p_Var1 == (fio_match_fn)0x0) {
      type = 4;
    }
    else {
      local_30[0] = (ulong)p_Var1 >> 0x38 | ((ulong)p_Var1 & 0xff000000000000) >> 0x28 |
                    ((ulong)p_Var1 & 0xff0000000000) >> 0x18 | ((ulong)p_Var1 & 0xff00000000) >> 8 |
                    ((ulong)p_Var1 & 0xff000000) << 8 | ((ulong)p_Var1 & 0xff0000) << 0x18 |
                    ((ulong)p_Var1 & 0xff00) << 0x28 | (long)p_Var1 << 0x38;
      local_38 = local_30;
      uStack_40 = 8;
      type = 6;
    }
    auVar7._16_8_ = 0;
    auVar8._8_8_ = local_38;
    auVar8._0_8_ = uStack_40;
    auVar8._16_8_ = 0;
    m_ = fio_msg_internal_create
                   (0,type,(fio_str_info_s)(auVar7 << 0x40),(fio_str_info_s)(auVar8 << 0x40),'\0',
                    '\x01');
    fio_cluster_client_sender(m_,-1);
  }
  return;
}

Assistant:

static void fio_pubsub_on_channel_create(channel_s *ch) {
  fio_lock(&fio_postoffice.engines.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.engines.set, pos) {
    if (!pos->hash)
      continue;
    pos->obj->subscribe(pos->obj,
                        (fio_str_info_s){.data = ch->name, .len = ch->name_len},
                        ch->match);
  }
  fio_unlock(&fio_postoffice.engines.lock);
  fio_cluster_inform_root_about_channel(ch, 1);
}